

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O2

int GetLatestDataRazorAHRS(RAZORAHRS *pRazorAHRS,RAZORAHRSDATA *pRazorAHRSData)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  RAZORAHRSDATA *pRVar5;
  char *pcVar6;
  RAZORAHRSDATA *pRVar7;
  size_t __n;
  byte bVar8;
  double dVar9;
  int Bytes;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  RAZORAHRSDATA *local_388;
  CHRONO chrono;
  char savebuf [256];
  char recvbuf [512];
  
  bVar8 = 0;
  Bytes = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x200);
  memset(savebuf,0,0x100);
  iVar1 = ReadRS232Port(&pRazorAHRS->RS232Port,(uint8 *)recvbuf,0xff,&Bytes);
  if (iVar1 == 0) {
    if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf,(long)Bytes,1,(FILE *)pRazorAHRS->pfSaveFile);
      fflush((FILE *)pRazorAHRS->pfSaveFile);
    }
    iVar1 = Bytes;
    local_388 = pRazorAHRSData;
    if (0xfe < Bytes) {
      while (iVar1 = Bytes, Bytes == 0xff) {
        dVar9 = GetTimeElapsedChronoQuick(&chrono);
        if (4.0 < dVar9) goto LAB_00111970;
        memcpy(savebuf,recvbuf,(long)Bytes);
        iVar1 = ReadRS232Port(&pRazorAHRS->RS232Port,(uint8 *)recvbuf,0xff,&Bytes);
        if (iVar1 != 0) goto LAB_00111740;
        if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,(long)Bytes,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
      }
      __n = (size_t)Bytes;
      memmove(recvbuf + (0xff - __n),recvbuf,__n);
      memcpy(recvbuf,savebuf + __n,(long)(0xff - iVar1));
      iVar1 = 0xff;
    }
    pcVar6 = FindLatestRazorAHRSSentence("#YPR=",recvbuf);
    pcVar3 = FindLatestRazorAHRSSentence("#YPRAG=",recvbuf);
    while (pRVar5 = local_388, pcVar6 == (char *)0x0 && pcVar3 == (char *)0x0) {
      dVar9 = GetTimeElapsedChronoQuick(&chrono);
      if (4.0 < dVar9) {
LAB_00111970:
        puts("Error reading data from a RazorAHRS : Message timeout. ");
        return 2;
      }
      if (0x1fe < iVar1) {
        puts("Error reading data from a RazorAHRS : Invalid data. ");
        return 4;
      }
      iVar2 = ReadRS232Port(&pRazorAHRS->RS232Port,(uint8 *)(recvbuf + iVar1),0x1ff - iVar1,&Bytes);
      if (iVar2 != 0) goto LAB_00111740;
      if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf + iVar1,(long)Bytes,1,(FILE *)pRazorAHRS->pfSaveFile);
        fflush((FILE *)pRazorAHRS->pfSaveFile);
      }
      iVar1 = iVar1 + Bytes;
      pcVar6 = FindLatestRazorAHRSSentence("#YPR=",recvbuf);
      pcVar3 = FindLatestRazorAHRSSentence("#YPRAG=",recvbuf);
    }
    local_388->Pitch = 0.0;
    local_388->Yaw = 0.0;
    local_388->gyrz = 0.0;
    local_388->Roll = 0.0;
    local_388->gyrx = 0.0;
    local_388->gyry = 0.0;
    local_388->accy = 0.0;
    local_388->accz = 0.0;
    local_388->roll = 0.0;
    local_388->accx = 0.0;
    local_388->yaw = 0.0;
    local_388->pitch = 0.0;
    if (pcVar3 == (char *)0x0) {
      iVar1 = __isoc99_sscanf(pcVar6,"#YPR=%lf,%lf,%lf",local_388,&local_388->pitch,&local_388->roll
                             );
      if (iVar1 != 3) goto LAB_00111b74;
    }
    else {
      iVar1 = __isoc99_sscanf(pcVar3,"#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",local_388,
                              &local_388->pitch,&local_388->roll,&local_388->accx,&local_388->accy,
                              &local_388->accz,&local_388->gyrx,&local_388->gyry,&local_388->gyrz);
      if (iVar1 != 9) {
LAB_00111b74:
        pcVar6 = "Error reading data from a RazorAHRS : Invalid data. ";
        goto LAB_00111747;
      }
    }
    dVar9 = (pRVar5->roll * 3.141592653589793) / 180.0;
    local_398 = (pRVar5->pitch * 3.141592653589793) / 180.0;
    local_390 = (pRVar5->yaw * 3.141592653589793) / 180.0;
    local_3a8 = pRazorAHRS->rollorientation + dVar9;
    local_3a0 = pRazorAHRS->rollp1;
    dVar9 = cos(dVar9 + pRazorAHRS->rollp2);
    dVar9 = fmod_2PI(dVar9 * local_3a0 + local_3a8);
    pRVar5->Roll = dVar9;
    local_3a8 = pRazorAHRS->pitchorientation + local_398;
    local_3a0 = pRazorAHRS->pitchp1;
    dVar9 = cos(local_398 + pRazorAHRS->pitchp2);
    dVar9 = fmod_2PI(dVar9 * local_3a0 + local_3a8);
    pRVar5->Pitch = dVar9;
    local_398 = pRazorAHRS->yaworientation + local_390;
    local_3a8 = pRazorAHRS->yawp1;
    dVar9 = cos(local_390 + pRazorAHRS->yawp2);
    dVar9 = fmod_2PI(dVar9 * local_3a8 + local_398);
    pRVar5->Yaw = dVar9;
    pRVar7 = &pRazorAHRS->LastRazorAHRSData;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      pRVar7->yaw = pRVar5->yaw;
      pRVar5 = (RAZORAHRSDATA *)((long)pRVar5 + (ulong)bVar8 * -0x10 + 8);
      pRVar7 = (RAZORAHRSDATA *)((long)pRVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    iVar1 = 0;
  }
  else {
LAB_00111740:
    pcVar6 = "Error reading data from a RazorAHRS. ";
LAB_00111747:
    puts(pcVar6);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetLatestDataRazorAHRS(RAZORAHRS* pRazorAHRS, RAZORAHRSDATA* pRazorAHRSData)
{
	char recvbuf[2*MAX_NB_BYTES_RAZORAHRS];
	char savebuf[MAX_NB_BYTES_RAZORAHRS];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_YPR = NULL;
	char* ptr_YPRAG = NULL;
	double roll = 0, pitch = 0, yaw = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_RAZORAHRS-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RazorAHRS. \n");
		return EXIT_FAILURE;
	}
	if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
		fflush(pRazorAHRS->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
			{
				printf("Error reading data from a RazorAHRS : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a RazorAHRS. \n");
				return EXIT_FAILURE;
			}
			if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
				fflush(pRazorAHRS->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
	ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);

	while ((!ptr_YPR)&&(!ptr_YPRAG))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
		{
			printf("Error reading data from a RazorAHRS : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_RAZORAHRS-1)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_RAZORAHRS-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RazorAHRS. \n");
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
		ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);
	}

	// Analyze data.

	memset(pRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (ptr_YPRAG)
	{
		if (sscanf(ptr_YPRAG, "#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll, 
			&pRazorAHRSData->accx, &pRazorAHRSData->accy, &pRazorAHRSData->accz, 
			&pRazorAHRSData->gyrx, &pRazorAHRSData->gyry, &pRazorAHRSData->gyrz) != 9)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sscanf(ptr_YPR, "#YPR=%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll) != 3)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	// Convert orientation information in angles in rad with corrections.

	roll = pRazorAHRSData->roll*M_PI/180.0;
	pitch = pRazorAHRSData->pitch*M_PI/180.0;
	yaw = pRazorAHRSData->yaw*M_PI/180.0;

	// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
	pRazorAHRSData->Roll = fmod_2PI(roll+pRazorAHRS->rollorientation+pRazorAHRS->rollp1*cos(roll+pRazorAHRS->rollp2));
	pRazorAHRSData->Pitch = fmod_2PI(pitch+pRazorAHRS->pitchorientation+pRazorAHRS->pitchp1*cos(pitch+pRazorAHRS->pitchp2));
	pRazorAHRSData->Yaw = fmod_2PI(yaw+pRazorAHRS->yaworientation+pRazorAHRS->yawp1*cos(yaw+pRazorAHRS->yawp2));

	pRazorAHRS->LastRazorAHRSData = *pRazorAHRSData;

	return EXIT_SUCCESS;
}